

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int store_char(char c,char **buf,int *buf_len,int *used)

{
  char *__ptr;
  int iVar1;
  
  iVar1 = *used;
  __ptr = *buf;
  if (iVar1 == *buf_len) {
    *buf_len = (int)((long)iVar1 + 0x10U);
    __ptr = (char *)realloc(__ptr,(long)iVar1 + 0x10U);
    if (__ptr == (char *)0x0) {
      store_char_cold_1();
      return -1;
    }
    *buf = __ptr;
    iVar1 = *used;
  }
  __ptr[iVar1] = c;
  *used = *used + 1;
  return 0;
}

Assistant:

static int
store_char(char c, char **buf, int *buf_len, int *used)
{
    char *new_buf;

    if (*used == *buf_len) {
        *buf_len += 16;
        new_buf = realloc(*buf, *buf_len * sizeof *new_buf);
        if (!new_buf) {
            fprintf(stderr, "Memory allocation error (%s).\n", strerror(errno));
            return -1;
        }
        *buf = new_buf;
    }

    (*buf)[*used] = c;
    ++(*used);
    return 0;
}